

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O0

bool __thiscall CDirectiveConditional::evaluate(CDirectiveConditional *this)

{
  ConditionType CVar1;
  bool bVar2;
  element_type *peVar3;
  long local_20;
  int64_t value;
  CDirectiveConditional *this_local;
  
  local_20 = 0;
  value = (int64_t)this;
  bVar2 = Expression::isLoaded(&this->expression);
  if ((!bVar2) || (bVar2 = Expression::evaluateInteger<long>(&this->expression,&local_20), bVar2)) {
    CVar1 = this->type;
    if (CVar1 == IF) {
      this_local._7_1_ = local_20 != 0;
    }
    else if (CVar1 == IFDEF) {
      peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->label);
      this_local._7_1_ = Label::isDefined(peVar3);
    }
    else if (CVar1 == IFNDEF) {
      peVar3 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->label);
      bVar2 = Label::isDefined(peVar3);
      this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
    }
    else {
      Logger::queueError<>(Error,"Invalid conditional type");
      this_local._7_1_ = false;
    }
  }
  else {
    Logger::queueError<>(Error,"Invalid conditional expression");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CDirectiveConditional::evaluate()
{
	int64_t value = 0;
	if (expression.isLoaded())
	{
		if (!expression.evaluateInteger(value))
		{
			Logger::queueError(Logger::Error, "Invalid conditional expression");
			return false;
		}
	}

	switch (type)
	{
	case ConditionType::IF:
		return value != 0;
	case ConditionType::IFDEF:
		return label->isDefined();
	case ConditionType::IFNDEF:
		return !label->isDefined();
	default:
		break;
	}
			
	Logger::queueError(Logger::Error, "Invalid conditional type");
	return false;
}